

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O3

void duckdb::LateMaterializationMaxRowsSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig local_1f8;
  
  switchD_01043a80::default(&local_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&local_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->late_materialization_max_rows = local_1f8.late_materialization_max_rows;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.http_logging_output._M_dataplus._M_p != &local_1f8.http_logging_output.field_2) {
    operator_delete(local_1f8.http_logging_output._M_dataplus._M_p);
  }
  if (local_1f8.result_collector.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1f8.result_collector.super__Function_base._M_manager)
              ((_Any_data *)&local_1f8.result_collector,(_Any_data *)&local_1f8.result_collector,
               __destroy_functor);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1f8.user_variables._M_h);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1f8.set_variables._M_h);
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1f8.profiler_settings._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.profiler_save_location._M_dataplus._M_p !=
      &local_1f8.profiler_save_location.field_2) {
    operator_delete(local_1f8.profiler_save_location._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.home_directory._M_dataplus._M_p != &local_1f8.home_directory.field_2) {
    operator_delete(local_1f8.home_directory._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LateMaterializationMaxRowsSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).late_materialization_max_rows = ClientConfig().late_materialization_max_rows;
}